

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

Instr * __thiscall
Inline::InlineScriptFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeData,StackSym *symCallerThis,
          ProfileId profileId,bool *pIsInlined,Instr *inlineeDefInstr,uint recursiveInlineDepth)

{
  ProfileId profiledCallSiteId;
  ScriptContext *scriptContext;
  Instr *pIVar1;
  Opnd *pOVar2;
  JITTimeWorkItem *this_00;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  ExecutionMode EVar7;
  ArgSlot AVar8;
  uint sourceContextId;
  uint functionId;
  RegSlot RVar9;
  uint32 postCallByteCodeOffset;
  JITTimeFunctionBody *pJVar10;
  undefined4 *puVar11;
  FunctionJITTimeInfo *pFVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  StackSym *pSVar17;
  undefined7 extraout_var;
  RegOpnd *this_01;
  undefined4 extraout_var_00;
  CodeGenWorkItemIDL *workItemData;
  CodeGenWorkItemIDL *pCVar18;
  intptr_t iVar19;
  Func *this_02;
  JITOutputIDL *outputData;
  Instr *pIVar20;
  undefined6 in_register_00000082;
  byte bVar21;
  Instr *local_188;
  Instr *inlineBailoutChecksBeforeInstr;
  bool local_128 [8];
  bool safeThis;
  StackSym *local_c8;
  StackSym *local_c0;
  Instr *local_b8;
  JITTimePolymorphicInlineCacheInfo *local_b0;
  JITTimeWorkItem *local_a8;
  ThreadContextInfo *local_a0;
  ScriptContextInfo *local_98;
  JitArenaAllocator *local_90;
  Instr *local_88;
  RegOpnd *local_80;
  undefined8 local_78;
  Inline *local_70;
  void *local_68;
  undefined8 local_60;
  ulong local_58;
  Func *local_50;
  FunctionJITTimeDataIDL *local_48;
  JITTimeFunctionBody *local_40;
  ProfileId local_32;
  
  local_58 = CONCAT44(local_58._4_4_,(int)CONCAT62(in_register_00000082,profileId));
  *pIsInlined = false;
  local_c8 = symCallerThis;
  if (this->topFunc->m_isBackgroundJIT == false) {
    scriptContext = (ScriptContext *)this->topFunc->m_scriptContextInfo;
    ThreadContext::ProbeStackNoDispose(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  }
  pIVar1 = callInstr->m_next;
  local_50 = callInstr->m_func;
  local_48 = &inlineeData->m_data;
  pJVar10 = FunctionJITTimeInfo::GetBody(inlineeData);
  bVar5 = JITTimeWorkItem::IsLoopBody(callInstr->m_func->m_workItem);
  if ((bVar5) && (bVar5 = JITTimeFunctionBody::UsesArgumentsObject(pJVar10), bVar5)) {
    return pIVar1;
  }
  local_88 = pIVar1;
  local_70 = this;
  local_40 = pJVar10;
  if ((callInstr->m_src2 != (Opnd *)0x0) &&
     (OVar6 = IR::Opnd::GetKind(callInstr->m_src2), OVar6 == OpndKindSym)) {
    pOVar2 = callInstr->m_src2;
    OVar6 = IR::Opnd::GetKind(pOVar2);
    if (OVar6 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar5) goto LAB_0054af1a;
      *puVar11 = 0;
      this = local_70;
    }
    pSVar17 = (StackSym *)pOVar2[1]._vptr_Opnd;
    if ((pSVar17->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar5) goto LAB_0054af1a;
      *puVar11 = 0;
      this = local_70;
    }
    AVar8 = StackSym::GetArgSlotNum(pSVar17);
    if (0xf < AVar8) {
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
      sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar10);
      pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
      functionId = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,sourceContextId,functionId);
      if (!bVar5) {
        return pIVar1;
      }
      pcVar13 = JITTimeFunctionBody::GetDisplayName(local_40);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                          ((FunctionJITTimeInfo *)local_48,(wchar (*) [42])&local_188);
      pOVar2 = callInstr->m_src2;
      OVar6 = IR::Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0054af1a;
        *puVar11 = 0;
      }
      pSVar17 = (StackSym *)pOVar2[1]._vptr_Opnd;
      if ((pSVar17->super_Sym).m_kind == SymKindStack) {
LAB_0054a92a:
        AVar8 = StackSym::GetArgSlotNum(pSVar17);
        pFVar3 = local_50;
        pJVar10 = JITTimeWorkItem::GetJITFunctionBody(local_50->m_workItem);
        pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar10);
        pFVar12 = JITTimeWorkItem::GetJITTimeInfo(pFVar3->m_workItem);
        pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_128);
        Output::Print(L"INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                      ,pcVar13,pcVar14,(ulong)AVar8,0xf,pcVar15,pcVar16);
        Output::Flush();
        return local_88;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (bVar5) {
        *puVar11 = 0;
        goto LAB_0054a92a;
      }
      goto LAB_0054af1a;
    }
  }
  *pIsInlined = true;
  pSVar17 = IR::Opnd::GetStackSym(callInstr->m_src1);
  local_68 = (void *)CONCAT71(local_68._1_7_,callInstr->m_src1->field_0xb);
  local_128[0] = false;
  if ((callInstr->m_opcode == NewScObjArray) || (callInstr->m_opcode == NewScObject)) {
    bVar5 = TryOptimizeCallInstrWithFixedMethod
                      (this,callInstr,(FunctionJITTimeInfo *)local_48,false,false,true,true,
                       local_128,false,0);
    bVar5 = SplitConstructorCall(this,callInstr,true,bVar5,&local_188,(Instr **)0x0);
    if ((bVar5) && (local_188 != (Instr *)0x0)) {
      local_60 = CONCAT71(extraout_var,1);
    }
    else {
      local_60 = CONCAT71(extraout_var,1);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x10ac,"(split && inlineBailoutChecksBeforeInstr != nullptr)",
                         "split && inlineBailoutChecksBeforeInstr != nullptr");
      if (!bVar5) goto LAB_0054af1a;
      *puVar11 = 0;
    }
  }
  else {
    local_60 = 0;
    TryOptimizeCallInstrWithFixedMethod
              (this,callInstr,(FunctionJITTimeInfo *)local_48,false,false,false,true,local_128,false
               ,0);
    local_188 = callInstr;
  }
  if (callInstr->m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x10b5,"(callInstr->IsProfiledInstr())","callInstr->IsProfiledInstr()");
    if (!bVar5) goto LAB_0054af1a;
    *puVar11 = 0;
  }
  if (callInstr->m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
    if (!bVar5) goto LAB_0054af1a;
    *puVar11 = 0;
  }
  local_32 = *(ProfileId *)&callInstr[1]._vptr_Instr;
  local_c0 = pSVar17;
  if (callInstr->m_dst == (Opnd *)0x0) {
    local_78 = 0xffffffff;
    local_80 = (RegOpnd *)0x0;
  }
  else {
    this_01 = (RegOpnd *)IR::Instr::UnlinkDst(callInstr);
    OVar6 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_0054af1a;
      *puVar11 = 0;
    }
    local_80 = this_01;
    RVar9 = StackSym::GetByteCodeRegSlot(this_01->m_sym);
    local_78 = CONCAT44(extraout_var_00,RVar9);
  }
  local_b8 = callInstr;
  workItemData = (CodeGenWorkItemIDL *)
                 new<Memory::JitArenaAllocator>(0x60,this->topFunc->m_alloc,0x3f1274);
  bVar5 = Func::IsJitInDebugMode(this->topFunc);
  workItemData->isJitInDebugMode = bVar5;
  workItemData->type = '\0';
  EVar7 = JITTimeWorkItem::GetJitMode(this->topFunc->m_workItem);
  workItemData->jitMode = EVar7;
  pCVar18 = JITTimeWorkItem::GetWorkItemData(this->topFunc->m_workItem);
  workItemData->nativeDataAddr = pCVar18->nativeDataAddr;
  workItemData->loopNumber = 0xffffffff;
  workItemData->jitData = local_48;
  local_a8 = (JITTimeWorkItem *)
             new<Memory::JitArenaAllocator>(0x1e0,this->topFunc->m_alloc,0x3f1274);
  JITTimeWorkItem::JITTimeWorkItem(local_a8,workItemData);
  pJVar10 = local_40;
  this_00 = this->topFunc->m_workItem;
  iVar19 = JITTimeFunctionBody::GetAddr(local_40);
  local_b0 = JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(this_00,iVar19);
  if (inlineeDefInstr == (Instr *)0x0) {
    pFVar12 = JITTimeWorkItem::GetJITTimeInfo(local_50->m_workItem);
    iVar19 = JITTimeFunctionBody::GetAddr(pJVar10);
    local_40 = (JITTimeFunctionBody *)
               FunctionJITTimeInfo::GetInlineeForTargetInlineeRuntimeData
                         (pFVar12,(ProfileId)local_58,iVar19);
  }
  else {
    pFVar12 = JITTimeWorkItem::GetJITTimeInfo(inlineeDefInstr->m_func->m_workItem);
    if (inlineeDefInstr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar5) {
LAB_0054af1a:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar11 = 0;
    }
    profiledCallSiteId = *(ProfileId *)&inlineeDefInstr[1]._vptr_Instr;
    iVar19 = JITTimeFunctionBody::GetAddr(local_40);
    local_40 = (JITTimeFunctionBody *)
               FunctionJITTimeInfo::GetInlineeForCallbackInlineeRuntimeData
                         (pFVar12,profiledCallSiteId,iVar19);
  }
  bVar21 = (byte)local_68 & 8;
  this_02 = (Func *)new<Memory::JitArenaAllocator>(0x420,this->topFunc->m_alloc,0x3f1274);
  pFVar3 = this->topFunc;
  local_90 = pFVar3->m_alloc;
  local_a0 = pFVar3->m_threadContextInfo;
  local_98 = pFVar3->m_scriptContextInfo;
  outputData = JITOutput::GetOutputData(&pFVar3->m_output);
  pIVar1 = local_b8;
  pFVar3 = this->topFunc;
  local_50 = (Func *)pFVar3->m_codeGenProfiler;
  local_68 = pFVar3->topFunc->m_codeGenAllocators;
  local_58 = (ulong)pFVar3->m_isBackgroundJIT;
  pFVar3 = local_b8->m_func;
  pIVar20 = IR::Instr::GetNextRealInstr(local_b8);
  postCallByteCodeOffset = IR::Instr::GetByteCodeOffset(pIVar20);
  Func::Func(this_02,local_90,local_a8,local_a0,local_98,outputData,(EntryPointInfo *)0x0,
             (FunctionJITRuntimeInfo *)local_40,local_b0,local_68,(ScriptContextProfiler *)local_50,
             SUB81(local_58,0),pFVar3,postCallByteCodeOffset,(RegSlot)local_78,SUB81(local_60,0),
             local_32,false);
  pIVar20 = local_88;
  InlineFunctionCommon
            (local_70,pIVar1,(bool)(bVar21 >> 3),local_c0,(FunctionJITTimeInfo *)local_48,this_02,
             local_88,local_80,local_188,local_c8,recursiveInlineDepth,local_128[0],false);
  return pIVar20;
}

Assistant:

IR::Instr *
Inline::InlineScriptFunction(IR::Instr *callInstr, const FunctionJITTimeInfo *const inlineeData, const StackSym *symCallerThis, const Js::ProfileId profileId, bool* pIsInlined, IR::Instr * inlineeDefInstr, uint recursiveInlineDepth)
{
    *pIsInlined = false;

    // This function is recursive, so when jitting in the foreground, probe the stack
    if (!this->topFunc->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(this->topFunc->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    IR::Instr *instrNext = callInstr->m_next;

    Func *funcCaller = callInstr->m_func;
    JITTimeFunctionBody *funcBody = inlineeData->GetBody();

    // We don't do stack args optimization in jitted loop body (because of lack of information about the code before and after the loop)
    // and we turn off stack arg optimization for the whole inline chain if we can't do it for one of the functionss.
    // Inlining a function that uses arguments object could potentially hurt perf because we'll have to create arguments object on the
    // heap for that function (versus otherwise the function will be jitted and have its arguments object creation optimized).
    // TODO: Allow arguments object creation to be optimized on a function level instead of an all-or-nothing approach.
    if (callInstr->m_func->IsLoopBody() && funcBody->UsesArgumentsObject())
    {
        return instrNext;
    }

    if (callInstr->GetSrc2() &&
        callInstr->GetSrc2()->IsSymOpnd() &&
        callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
        // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
        // data matching does not take into account some types of changes to source code. Need to check this again with current
        // information.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
            funcBody->GetDisplayName(), inlineeData->GetDebugNumberSet(debugStringBuffer), callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
            Js::InlineeCallInfo::MaxInlineeArgoutCount, funcCaller->GetJITFunctionBody()->GetDisplayName(), funcCaller->GetDebugNumberSet(debugStringBuffer2));
        return instrNext;
    }

    *pIsInlined = true;

    // Save off the call target operand (function object) so we can extend its lifetime as needed, even if
    // the call instruction gets transformed to CallIFixed.
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    // We are committed to inlining, optimize the call instruction for fixed fields now and don't attempt it later.
    bool isFixed = false;

    JS_ETW(EventWriteJSCRIPT_BACKEND_INLINE(
        funcCaller->GetFunctionNumber(), funcBody->GetFunctionNumber(),
        funcCaller->GetJITFunctionBody()->GetDisplayName(), funcBody->GetDisplayName()));// REVIEW: OOP JIT, was GetExternalDisplayName, does this matter?

    bool isCtor = false;
    bool safeThis = false;
    IR::Instr *inlineBailoutChecksBeforeInstr;
    if (callInstr->m_opcode == Js::OpCode::NewScObject || callInstr->m_opcode == Js::OpCode::NewScObjArray)
    {
        isCtor = true;
        isFixed = TryOptimizeCallInstrWithFixedMethod(callInstr, inlineeData,
            false /*isPolymorphic*/, false /*isBuiltIn*/, isCtor /*isCtor*/, true /*isInlined*/, safeThis /*&safeThis*/);
        bool split = SplitConstructorCall(callInstr, true, isFixed, &inlineBailoutChecksBeforeInstr);
        Assert(split && inlineBailoutChecksBeforeInstr != nullptr);
    }
    else
    {
        isFixed = TryOptimizeCallInstrWithFixedMethod(callInstr, inlineeData,
            false /*isPolymorphic*/, false /*isBuiltIn*/, isCtor /*isCtor*/, true /*isInlined*/, safeThis /*&safeThis*/);
        inlineBailoutChecksBeforeInstr = callInstr;
    }

    Assert(callInstr->IsProfiledInstr());
    Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);

    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    CodeGenWorkItemIDL * workItemData = JitAnewStruct(this->topFunc->m_alloc, CodeGenWorkItemIDL);

    workItemData->isJitInDebugMode = this->topFunc->IsJitInDebugMode();
    workItemData->type = JsFunctionType;
    workItemData->jitMode = static_cast<char>(this->topFunc->GetWorkItem()->GetJitMode());
    workItemData->nativeDataAddr = this->topFunc->GetWorkItem()->GetWorkItemData()->nativeDataAddr;
    workItemData->loopNumber = Js::LoopHeader::NoLoop;

    workItemData->jitData = (FunctionJITTimeDataIDL*)(inlineeData);
    JITTimeWorkItem * jitWorkItem = JitAnew(this->topFunc->m_alloc, JITTimeWorkItem, workItemData);


    JITTimePolymorphicInlineCacheInfo * entryPointPolymorphicInlineCacheInfo = this->topFunc->GetWorkItem()->GetInlineePolymorphicInlineCacheInfo(funcBody->GetAddr());
    const FunctionJITRuntimeInfo * runtimeInfo = (inlineeDefInstr == nullptr)
        ? funcCaller->GetWorkItem()->GetJITTimeInfo()->GetInlineeForTargetInlineeRuntimeData(profileId, funcBody->GetAddr())
        : inlineeDefInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetInlineeForCallbackInlineeRuntimeData(static_cast<Js::ProfileId>(inlineeDefInstr->AsProfiledInstr()->u.profileId), funcBody->GetAddr());

#if !FLOATVAR
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        runtimeInfo,
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetNumberAllocator(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        callInstr->m_func,
        callInstr->GetNextRealInstr()->GetByteCodeOffset(),
        returnRegSlot,
        isCtor,
        callSiteId,
        false);
#else
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        runtimeInfo,
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        callInstr->m_func,
        callInstr->GetNextRealInstr()->GetByteCodeOffset(),
        returnRegSlot,
        isCtor,
        callSiteId,
        false);
#endif

    return InlineFunctionCommon(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlinee, instrNext, returnValueOpnd, inlineBailoutChecksBeforeInstr, symCallerThis, recursiveInlineDepth, safeThis);
}